

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<SomeClass> * __thiscall
pybind11::class_<SomeClass>::def<pybind11_init()::__0>(class_<SomeClass> *this,char *name_,type *f)

{
  handle local_a0;
  PyObject *local_98;
  obj_attr_accessor local_90;
  handle local_60;
  PyObject *local_58;
  handle local_50;
  handle local_48;
  sibling local_40;
  is_method local_38;
  name local_30;
  cpp_function local_28;
  cpp_function cf;
  type *f_local;
  char *name__local;
  class_<SomeClass> *this_local;
  
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  pybind11::name::name(&local_30,name_);
  is_method::is_method(&local_38,(handle *)this);
  local_50.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  none::none((none *)&local_60);
  local_58 = local_60.m_ptr;
  getattr((pybind11 *)&local_48,local_50,name_,local_60);
  sibling::sibling(&local_40,&local_48);
  cpp_function::
  cpp_function<pybind11_init()::__0,pybind11::name,pybind11::is_method,pybind11::sibling,void>
            (&local_28,f,&local_30,&local_38,&local_40);
  object::~object((object *)&local_48);
  none::~none((none *)&local_60);
  cpp_function::name((cpp_function *)&local_a0);
  local_98 = local_a0.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_90,(object_api<pybind11::handle> *)this,local_a0);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_90,&local_28);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_90);
  object::~object((object *)&local_a0);
  cpp_function::~cpp_function(&local_28);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(std::forward<Func>(f), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }